

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.cpp
# Opt level: O2

EqualIgnoreCaseConstraint *
OpenMD::isEqualIgnoreCase(EqualIgnoreCaseConstraint *__return_storage_ptr__,string *str)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)str);
  EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

EqualIgnoreCaseConstraint isEqualIgnoreCase(std::string str) {
    return EqualIgnoreCaseConstraint(str);
  }